

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

Info * __thiscall CMU462::Vertex::getInfo_abi_cxx11_(Info *__return_storage_ptr__,Vertex *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_908;
  ostringstream m6;
  ostringstream m5;
  ostringstream m4;
  ostringstream m3;
  ostringstream m2;
  ostringstream m1;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m2);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m3);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m4);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m5);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&m6);
  std::operator<<((ostream *)&m1,"VERTEX");
  poVar3 = std::operator<<((ostream *)&m2,"Address: ");
  std::ostream::_M_insert<void_const*>(poVar3);
  poVar3 = std::operator<<((ostream *)&m3,"Halfedge: ");
  std::ostream::_M_insert<void_const*>(poVar3);
  poVar3 = std::operator<<((ostream *)&m4,"Degree: ");
  degree(this);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<((ostream *)&m5,"Position: ");
  operator<<(poVar3,&this->position);
  poVar3 = std::operator<<((ostream *)&m6,"Boundary: ");
  bVar2 = isBoundary(this);
  pcVar4 = "NO";
  if (bVar2) {
    pcVar4 = "YES";
  }
  std::operator<<(poVar3,pcVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,8);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_908);
  std::__cxx11::string::~string((string *)&local_908);
  paVar1 = &local_908.field_2;
  local_908._M_string_length = 0;
  local_908.field_2._M_local_buf[0] = '\0';
  local_908._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_908);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_908);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_908);
  std::__cxx11::string::~string((string *)&local_908);
  local_908._M_string_length = 0;
  local_908.field_2._M_local_buf[0] = '\0';
  local_908._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_908);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_908);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_908);
  std::__cxx11::string::~string((string *)&local_908);
  local_908._M_string_length = 0;
  local_908.field_2._M_local_buf[0] = '\0';
  local_908._M_dataplus._M_p = (pointer)paVar1;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_908);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__,&local_908);
  std::__cxx11::string::~string((string *)&local_908);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m6);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m5);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m4);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m2);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&m1);
  return __return_storage_ptr__;
}

Assistant:

Info Vertex::getInfo() {
  Info info;

  ostringstream m1, m2, m3, m4, m5, m6;
  m1 << "VERTEX";
  m2 << "Address: " << this;
  m3 << "Halfedge: " << elementAddress(halfedge());
  m4 << "Degree: " << degree();
  m5 << "Position: " << position;
  m6 << "Boundary: " << (isBoundary() ? "YES" : "NO");

  info.reserve(8);
  info.push_back(m1.str());
  info.push_back(string());
  info.push_back(m2.str());
  info.push_back(m3.str());
  info.push_back(string());
  info.push_back(m4.str());
  info.push_back(m5.str());
  info.push_back(string());
  info.push_back(m6.str());

  return info;
}